

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

string * __thiscall
compiler::AssemblerCompiler::do_var_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Var *variable)

{
  Var *variable_local;
  AssemblerCompiler *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&variable->name);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_var(const Var *variable) {
    return variable->name;
}